

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O1

void __thiscall Ptex::v2_2::PtexSeparableKernel::stripZeros(PtexSeparableKernel *this)

{
  float *pfVar1;
  float fVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  
  pfVar3 = this->ku;
  if ((*pfVar3 == 0.0) && (!NAN(*pfVar3))) {
    iVar5 = this->u;
    iVar4 = this->uw;
    do {
      iVar5 = iVar5 + 1;
      iVar4 = iVar4 + -1;
      pfVar1 = pfVar3 + 1;
      pfVar3 = pfVar3 + 1;
    } while (*pfVar1 == 0.0);
    this->ku = pfVar3;
    this->u = iVar5;
    this->uw = iVar4;
  }
  iVar5 = this->uw;
  if ((pfVar3[(long)iVar5 + -1] == 0.0) && (!NAN(pfVar3[(long)iVar5 + -1]))) {
    pfVar3 = pfVar3 + (long)iVar5 + -2;
    do {
      fVar2 = *pfVar3;
      iVar5 = iVar5 + -1;
      pfVar3 = pfVar3 + -1;
    } while (fVar2 == 0.0);
    this->uw = iVar5;
  }
  pfVar3 = this->kv;
  if ((*pfVar3 == 0.0) && (!NAN(*pfVar3))) {
    iVar5 = this->v;
    iVar4 = this->vw;
    do {
      iVar5 = iVar5 + 1;
      iVar4 = iVar4 + -1;
      pfVar1 = pfVar3 + 1;
      pfVar3 = pfVar3 + 1;
    } while (*pfVar1 == 0.0);
    this->kv = pfVar3;
    this->v = iVar5;
    this->vw = iVar4;
  }
  iVar5 = this->vw;
  if ((pfVar3[(long)iVar5 + -1] == 0.0) && (!NAN(pfVar3[(long)iVar5 + -1]))) {
    pfVar3 = pfVar3 + (long)iVar5 + -2;
    do {
      fVar2 = *pfVar3;
      iVar5 = iVar5 + -1;
      pfVar3 = pfVar3 + -1;
    } while (fVar2 == 0.0);
    this->vw = iVar5;
  }
  return;
}

Assistant:

void stripZeros()
    {
        while (ku[0] == 0) { ku++; u++; uw--; }
        while (ku[uw-1] == 0) { uw--; }
        while (kv[0] == 0) { kv++; v++; vw--; }
        while (kv[vw-1] == 0) { vw--; }
        assert(uw > 0 && vw > 0);
    }